

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O1

DatabaseInterface * Fossilize::create_stream_archive_database(char *path,DatabaseMode mode)

{
  StreamArchive *this;
  allocator local_41;
  string local_40;
  
  this = (StreamArchive *)operator_new(0x2b8);
  std::__cxx11::string::string((string *)&local_40,path,&local_41);
  StreamArchive::StreamArchive(this,&local_40,mode);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return &this->super_DatabaseInterface;
}

Assistant:

DatabaseInterface *create_stream_archive_database(const char *path, DatabaseMode mode)
{
	auto *db = new StreamArchive(path, mode);
	return db;
}